

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall duckdb::TopNGlobalSinkState::~TopNGlobalSinkState(TopNGlobalSinkState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__TopNGlobalSinkState_019c5670;
  p_Var1 = (this->boundary_value).boundary_vector.auxiliary.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->boundary_value).boundary_vector.buffer.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->boundary_value).boundary_vector.validity.
                   super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           + 8))->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  LogicalType::~LogicalType(&(this->boundary_value).boundary_vector.type);
  pcVar2 = (this->boundary_value).boundary_value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->boundary_value).boundary_value.field_2) {
    operator_delete(pcVar2);
  }
  TopNHeap::~TopNHeap(&this->heap);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  return;
}

Assistant:

TopNGlobalSinkState(ClientContext &context, const PhysicalTopN &op)
	    : heap(context, op.types, op.orders, op.limit, op.offset), boundary_value(op) {
	}